

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O0

bool __thiscall IR::PropertySymOpnd::SetMonoGuardType(PropertySymOpnd *this,JITTypeHolder type)

{
  bool bVar1;
  EquivalentTypeSet *this_00;
  bool local_43;
  bool local_42;
  byte local_41;
  JITTypeHolderBase<void> local_38;
  PropertySymOpnd *local_30;
  nullptr_t local_28;
  PropertySymOpnd *local_20;
  PropertySymOpnd *this_local;
  JITTypeHolder type_local;
  
  local_28 = (nullptr_t)0x0;
  local_20 = this;
  this_local = (PropertySymOpnd *)type.t;
  bVar1 = JITTypeHolderBase<void>::operator==(&this->monoGuardType,&local_28);
  if (!bVar1) {
    bVar1 = JITTypeHolderBase<void>::operator==
                      (&this->monoGuardType,(JITTypeHolderBase<void> *)&this_local);
    local_41 = 1;
    if (!bVar1) goto LAB_004f05ec;
  }
  bVar1 = HasEquivalentTypeSet(this);
  if (bVar1) {
    this_00 = GetEquivalentTypeSet(this);
    local_30 = this_local;
    bVar1 = Js::EquivalentTypeSet::Contains(this_00,(JITTypeHolder)this_local,(uint16 *)0x0);
    local_42 = true;
    if (!bVar1) goto LAB_004f05ac;
  }
  else {
LAB_004f05ac:
    bVar1 = HasEquivalentTypeSet(this);
    local_43 = false;
    if (!bVar1) {
      local_38.t = (Type)GetType(this);
      local_43 = JITTypeHolderBase<void>::operator==
                           (&local_38,(JITTypeHolderBase<void> *)&this_local);
    }
    local_42 = local_43;
  }
  local_41 = local_42 ^ 0xff;
LAB_004f05ec:
  bVar1 = (local_41 & 1) == 0;
  if (bVar1) {
    (this->monoGuardType).t = (Type)this_local;
  }
  return bVar1;
}

Assistant:

bool SetMonoGuardType(JITTypeHolder type)
    {
        if (!(this->monoGuardType == nullptr || this->monoGuardType == type) ||
            !((HasEquivalentTypeSet() && GetEquivalentTypeSet()->Contains(type)) ||
              (!HasEquivalentTypeSet() && GetType() == type)))
        {
            // Required type is not in the available set, or we already set the type to something else. Inform the caller.
            return false;
        }
        this->monoGuardType = type;
        return true;
    }